

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeClose(Btree *p)

{
  int *piVar1;
  int iVar2;
  BtShared *p_00;
  BtCursor *pBVar3;
  Btree *pBVar4;
  Btree *pBVar5;
  bool bVar6;
  BtCursor *pCur;
  BtShared *pBVar7;
  int extraout_EAX;
  sqlite3_mutex *psVar8;
  BtShared **ppBVar9;
  BtShared *pBVar10;
  u8 *p_01;
  
  p_00 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBVar3 = p_00->pCursor;
  while (pCur = pBVar3, pCur != (BtCursor *)0x0) {
    pBVar3 = pCur->pNext;
    if (pCur->pBtree == p) {
      sqlite3BtreeCloseCursor(pCur);
    }
  }
  sqlite3BtreeRollback(p,0,0);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if ((*piVar1 != 0) || (unlockBtreeMutex(p), p->sharable != '\0')) {
      bVar6 = true;
      if ((sqlite3Config.bCoreMutex == 0) ||
         (psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar8 == (sqlite3_mutex *)0x0)) {
        psVar8 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar8);
        bVar6 = false;
      }
      iVar2 = p_00->nRef;
      p_00->nRef = iVar2 + -1;
      if (iVar2 < 2) {
        pBVar7 = sqlite3SharedCacheList;
        if (sqlite3SharedCacheList == p_00) {
          ppBVar9 = &sqlite3SharedCacheList;
        }
        else {
          do {
            pBVar10 = pBVar7;
            if (pBVar10 == (BtShared *)0x0) goto LAB_0014aeb9;
            pBVar7 = pBVar10->pNext;
          } while (pBVar10->pNext != p_00);
          ppBVar9 = &pBVar10->pNext;
        }
        *ppBVar9 = p_00->pNext;
LAB_0014aeb9:
        if (p_00->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexFree)(p_00->mutex);
        }
      }
      if (!bVar6) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar8);
      }
      if (1 < iVar2) goto LAB_0014af38;
    }
  }
  sqlite3PagerClose(p_00->pPager,p->db);
  if ((p_00->xFreeSchema != (_func_void_void_ptr *)0x0) && (p_00->pSchema != (void *)0x0)) {
    (*p_00->xFreeSchema)(p_00->pSchema);
  }
  if (p_00->pSchema != (void *)0x0) {
    sqlite3_free(p_00->pSchema);
  }
  if (p_00->pTmpSpace != (u8 *)0x0) {
    p_01 = p_00->pTmpSpace + -4;
    p_00->pTmpSpace = p_01;
    pcache1Free(p_01);
    p_00->pTmpSpace = (u8 *)0x0;
  }
  sqlite3_free(p_00);
LAB_0014af38:
  pBVar4 = p->pNext;
  pBVar5 = p->pPrev;
  if (pBVar5 != (Btree *)0x0) {
    pBVar5->pNext = pBVar4;
  }
  if (pBVar4 != (Btree *)0x0) {
    pBVar4->pPrev = pBVar5;
  }
  sqlite3_free(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;
  BtCursor *pCur;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  pCur = pBt->pCursor;
  while( pCur ){
    BtCursor *pTmp = pCur;
    pCur = pCur->pNext;
    if( pTmp->pBtree==p ){
      sqlite3BtreeCloseCursor(pTmp);
    }
  }

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans 
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}